

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O2

void __thiscall GetUserPostsRequest::GetUserPostsRequest(GetUserPostsRequest *this,Event *e)

{
  bool bVar1;
  reference this_00;
  EventNotValid *this_01;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  keysToBeInEvent;
  allocator local_b2;
  allocator local_b1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80 [64];
  string local_40;
  
  (this->username)._M_dataplus._M_p = (pointer)&(this->username).field_2;
  (this->username)._M_string_length = 0;
  (this->username).field_2._M_local_buf[0] = '\0';
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_b0,e);
  std::__cxx11::string::string((string *)&local_a0,"type",&local_b1);
  std::__cxx11::string::string(local_80,"username",&local_b2);
  keysToBeInEvent._M_len = 2;
  keysToBeInEvent._M_array = &local_a0;
  bVar1 = checkEventKeys(&local_b0,keysToBeInEvent);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_a0._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_b0);
  if (bVar1) {
    this_00 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)e,"username");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_a0,this_00);
    std::__cxx11::string::operator=((string *)this,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    return;
  }
  this_01 = (EventNotValid *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_40,"Improper GET_USER_POSTS_REQUEST",(allocator *)&local_a0);
  EventNotValid::EventNotValid(this_01,&local_40);
  __cxa_throw(this_01,&EventNotValid::typeinfo,EventError::~EventError);
}

Assistant:

explicit GetUserPostsRequest(Event e){
	  if(!checkEventKeys(e, {"type", "username"})) {
		  throw EventNotValid("Improper GET_USER_POSTS_REQUEST");
	  }
	  try{
		  username = e["username"].get<std::string>();
	  }
	  catch(...){
		  throw EventNotValid("Improper GET_N_NEW_POSTS_RESPONSE");
	  }
  }